

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuillotineBinPack.cpp
# Opt level: O1

void __thiscall GuillotineBinPack::Init(GuillotineBinPack *this,int width,int height)

{
  uint *puVar1;
  uint uVar2;
  Rect *pRVar3;
  
  this->binWidth = width;
  this->binHeight = height;
  if ((this->disjointRects).rects.Count != 0) {
    (this->disjointRects).rects.Count = 0;
  }
  if ((this->usedRectangles).Count != 0) {
    (this->usedRectangles).Count = 0;
  }
  if ((this->freeRectangles).Count != 0) {
    (this->freeRectangles).Count = 0;
  }
  TArray<Rect,_Rect>::Grow(&this->freeRectangles,1);
  pRVar3 = (this->freeRectangles).Array;
  uVar2 = (this->freeRectangles).Count;
  pRVar3[uVar2].x = 0;
  pRVar3[uVar2].y = 0;
  pRVar3[uVar2].width = width;
  pRVar3[uVar2].height = height;
  puVar1 = &(this->freeRectangles).Count;
  *puVar1 = *puVar1 + 1;
  return;
}

Assistant:

void GuillotineBinPack::Init(int width, int height)
{
	binWidth = width;
	binHeight = height;

#ifdef _DEBUG
	disjointRects.Clear();
#endif

	// Clear any memory of previously packed rectangles.
	usedRectangles.Clear();

	// We start with a single big free rectangle that spans the whole bin.
	Rect n;
	n.x = 0;
	n.y = 0;
	n.width = width;
	n.height = height;

	freeRectangles.Clear();
	freeRectangles.Push(n);
}